

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O1

VRle __thiscall VRasterizer::rle(VRasterizer *this)

{
  SharedRle *this_00;
  model *pmVar1;
  undefined8 *in_RSI;
  
  this_00 = (SharedRle *)*in_RSI;
  if (this_00 == (SharedRle *)0x0) {
    (this->d).super___shared_ptr<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    vcow_ptr<VRle::Data>::vcow_ptr((vcow_ptr<VRle::Data> *)this);
  }
  else {
    SharedRle::wait(this_00,in_RSI);
    pmVar1 = (this_00->_rle).d.mModel;
    (this->d).super___shared_ptr<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pmVar1;
    LOCK();
    (pmVar1->mRef).super___atomic_base<unsigned_long>._M_i =
         (pmVar1->mRef).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  return (VRle)(vcow_ptr<VRle::Data>)this;
}

Assistant:

VRle VRasterizer::rle()
{
    if (!d) return VRle();
    return d->rle();
}